

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

IntVect __thiscall amrex::CoordSys::UpperIndex(CoordSys *this,Real *point)

{
  long in_RSI;
  long in_RDI;
  IntVect IVar1;
  int k;
  IntVect ix;
  int local_2c;
  IntVect local_18 [2];
  int iVar2;
  
  IntVect::IntVect(local_18);
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    local_18[0].vect[local_2c] =
         (int)((*(double *)(in_RSI + (long)local_2c * 8) -
               *(double *)(in_RDI + 8 + (long)local_2c * 8)) /
              *(double *)(in_RDI + 0x20 + (long)local_2c * 8));
  }
  IVar1.vect[0] = local_18[0].vect[0];
  IVar1.vect[1] = local_18[0].vect[1];
  register0x00000010 = local_18[0].vect[2];
  return (IntVect)IVar1.vect;
}

Assistant:

IntVect
CoordSys::UpperIndex(const Real* point) const noexcept
{
    AMREX_ASSERT(ok);
    AMREX_ASSERT(point != 0);
    IntVect ix;
    for (int k = 0; k < AMREX_SPACEDIM; k++)
    {
        ix[k] = (int) ((point[k]-offset[k])/dx[k]);
    }
    return ix;
}